

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrent_queue.hpp
# Opt level: O2

void __thiscall
concurrent_queue<oqpi::task_handle>::push(concurrent_queue<oqpi::task_handle> *this,task_handle *t)

{
  std::mutex::lock(&this->mutex_);
  std::deque<oqpi::task_handle,std::allocator<oqpi::task_handle>>::
  emplace_back<oqpi::task_handle_const&>
            ((deque<oqpi::task_handle,std::allocator<oqpi::task_handle>> *)&this->queue_,t);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void push(const T &t)
    {
        lock_t __l(mutex_);
        queue_.emplace(t);
    }